

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::ChangeTraceConfig
          (ConsumerEndpointImpl *this,TraceConfig *cfg)

{
  undefined8 in_RAX;
  char *fname;
  
  if (this->tracing_session_id_ != 0) {
    TracingServiceImpl::ChangeTraceConfig(this->service_,this,cfg);
    return;
  }
  fname = base::Basename(
                        "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                        );
  base::LogMessage(kLogInfo,fname,0xe8a3,
                   "Consumer called ChangeTraceConfig() but tracing was not active",in_RAX);
  return;
}

Assistant:

void TracingServiceImpl::ConsumerEndpointImpl::ChangeTraceConfig(
    const TraceConfig& cfg) {
  if (!tracing_session_id_) {
    PERFETTO_LOG(
        "Consumer called ChangeTraceConfig() but tracing was "
        "not active");
    return;
  }
  service_->ChangeTraceConfig(this, cfg);
}